

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

bool __thiscall duckdb_re2::CharClassBuilder::AddRange(CharClassBuilder *this,Rune lo,Rune hi)

{
  RuneRangeSet *this_00;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr *pp_Var3;
  uint uVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  uint uVar7;
  _Base_ptr p_Var8;
  const_iterator cVar9;
  RuneRange local_30;
  
  if (hi < lo) {
    return false;
  }
  if (0x40 < hi && lo < 0x7b) {
    uVar4 = 0x41;
    if (0x41 < lo) {
      uVar4 = lo;
    }
    uVar7 = 0x5a;
    if ((uint)hi < 0x5a) {
      uVar7 = hi;
    }
    if (uVar4 <= uVar7) {
      this->upper_ = this->upper_ |
                     ~(-1 << (((char)uVar7 - (char)uVar4) + 1U & 0x1f)) <<
                     ((char)uVar4 + 0xbfU & 0x1f);
    }
    uVar4 = 0x61;
    if (0x61 < lo) {
      uVar4 = lo;
    }
    uVar7 = 0x7a;
    if ((uint)hi < 0x7a) {
      uVar7 = hi;
    }
    if (uVar4 <= uVar7) {
      this->lower_ = this->lower_ |
                     ~(-1 << (((char)uVar7 - (char)uVar4) + 1U & 0x1f)) <<
                     ((char)uVar4 + 0x9fU & 0x1f);
    }
  }
  this_00 = &this->ranges_;
  p_Var5 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->ranges_)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = &p_Var1->_M_header;
  p_Var6 = p_Var5;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      p_Var2 = p_Var6 + 1;
      if (lo <= *(int *)&p_Var2->field_0x4) {
        p_Var8 = p_Var6;
      }
      pp_Var3 = &p_Var6->_M_left;
      p_Var6 = pp_Var3[*(int *)&p_Var2->field_0x4 < lo];
    } while (pp_Var3[*(int *)&p_Var2->field_0x4 < lo] != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var8 != p_Var1) && ((int)p_Var8[1]._M_color <= lo)) &&
       (hi <= *(int *)&p_Var8[1].field_0x4)) {
      return false;
    }
    if ((0 < lo) && (p_Var5 != (_Base_ptr)0x0)) {
      cVar9._M_node = &p_Var1->_M_header;
      do {
        if (lo + -1 <= *(int *)&p_Var5[1].field_0x4) {
          cVar9._M_node = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(int *)&p_Var5[1].field_0x4 < lo + -1];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)cVar9._M_node != p_Var1) && ((int)cVar9._M_node[1]._M_color < lo)) {
        lo = cVar9._M_node[1]._M_color;
        uVar4 = *(uint *)&cVar9._M_node[1].field_0x4;
        if (hi < (int)uVar4) {
          hi = uVar4;
        }
        this->nrunes_ = this->nrunes_ + ~uVar4 + lo;
        std::
        _Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
        ::erase_abi_cxx11_((_Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
                            *)this_00,cVar9);
      }
    }
  }
  if ((hi < 0x10ffff) &&
     (p_Var5 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var5 != (_Base_ptr)0x0)) {
    cVar9._M_node = &p_Var1->_M_header;
    do {
      if (hi < *(int *)&p_Var5[1].field_0x4) {
        cVar9._M_node = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(int *)&p_Var5[1].field_0x4 <= hi];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)cVar9._M_node != p_Var1) &&
       ((int)cVar9._M_node[1]._M_color <= (int)(hi + 1U))) {
      hi = *(Rune *)&cVar9._M_node[1].field_0x4;
      this->nrunes_ = this->nrunes_ + ~hi + cVar9._M_node[1]._M_color;
      std::
      _Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
      ::erase_abi_cxx11_((_Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
                          *)this_00,cVar9);
    }
  }
  p_Var6 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  while (cVar9._M_node = &p_Var1->_M_header, p_Var6 != (_Base_ptr)0x0) {
    do {
      if (lo <= *(int *)&p_Var6[1].field_0x4) {
        cVar9._M_node = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(int *)&p_Var6[1].field_0x4 < lo];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)cVar9._M_node == p_Var1) || (hi < (int)cVar9._M_node[1]._M_color))
    break;
    this->nrunes_ =
         this->nrunes_ + ~*(uint *)&cVar9._M_node[1].field_0x4 + cVar9._M_node[1]._M_color;
    std::
    _Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
    ::erase_abi_cxx11_((_Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
                        *)this_00,cVar9);
    p_Var6 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  }
  this->nrunes_ = this->nrunes_ + (hi - lo) + 1;
  local_30.lo = lo;
  local_30.hi = hi;
  std::
  _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
  ::_M_insert_unique<duckdb_re2::RuneRange>(&this_00->_M_t,&local_30);
  return true;
}

Assistant:

bool CharClassBuilder::AddRange(Rune lo, Rune hi) {
  if (hi < lo)
    return false;

  if (lo <= 'z' && hi >= 'A') {
    // Overlaps some alpha, maybe not all.
    // Update bitmaps telling which ASCII letters are in the set.
    Rune lo1 = std::max<Rune>(lo, 'A');
    Rune hi1 = std::min<Rune>(hi, 'Z');
    if (lo1 <= hi1)
      upper_ |= ((1 << (hi1 - lo1 + 1)) - 1) << (lo1 - 'A');

    lo1 = std::max<Rune>(lo, 'a');
    hi1 = std::min<Rune>(hi, 'z');
    if (lo1 <= hi1)
      lower_ |= ((1 << (hi1 - lo1 + 1)) - 1) << (lo1 - 'a');
  }

  {  // Check whether lo, hi is already in the class.
    iterator it = ranges_.find(RuneRange(lo, lo));
    if (it != end() && it->lo <= lo && hi <= it->hi)
      return false;
  }

  // Look for a range abutting lo on the left.
  // If it exists, take it out and increase our range.
  if (lo > 0) {
    iterator it = ranges_.find(RuneRange(lo-1, lo-1));
    if (it != end()) {
      lo = it->lo;
      if (it->hi > hi)
        hi = it->hi;
      nrunes_ -= it->hi - it->lo + 1;
      ranges_.erase(it);
    }
  }

  // Look for a range abutting hi on the right.
  // If it exists, take it out and increase our range.
  if (hi < Runemax) {
    iterator it = ranges_.find(RuneRange(hi+1, hi+1));
    if (it != end()) {
      hi = it->hi;
      nrunes_ -= it->hi - it->lo + 1;
      ranges_.erase(it);
    }
  }

  // Look for ranges between lo and hi.  Take them out.
  // This is only safe because the set has no overlapping ranges.
  // We've already removed any ranges abutting lo and hi, so
  // any that overlap [lo, hi] must be contained within it.
  for (;;) {
    iterator it = ranges_.find(RuneRange(lo, hi));
    if (it == end())
      break;
    nrunes_ -= it->hi - it->lo + 1;
    ranges_.erase(it);
  }

  // Finally, add [lo, hi].
  nrunes_ += hi - lo + 1;
  ranges_.insert(RuneRange(lo, hi));
  return true;
}